

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

int nk_str_insert_text_utf8(nk_str *str,int pos,char *text,int len)

{
  int iVar1;
  nk_rune local_38;
  int local_34;
  nk_rune unicode;
  int byte_len;
  int i;
  int len_local;
  char *text_local;
  nk_str *pnStack_18;
  int pos_local;
  nk_str *str_local;
  
  unicode = 0;
  local_34 = 0;
  byte_len = len;
  _i = text;
  text_local._4_4_ = pos;
  pnStack_18 = str;
  if (str == (nk_str *)0x0) {
    __assert_fail("str",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                  ,0x20b6,"int nk_str_insert_text_utf8(struct nk_str *, int, const char *, int)");
  }
  if (text != (char *)0x0) {
    if (((str == (nk_str *)0x0) || (text == (char *)0x0)) || (len == 0)) {
      str_local._4_4_ = 0;
    }
    else {
      for (unicode = 0; (int)unicode < byte_len; unicode = unicode + 1) {
        iVar1 = nk_utf_decode(_i + local_34,&local_38,4);
        local_34 = iVar1 + local_34;
      }
      nk_str_insert_at_rune(pnStack_18,text_local._4_4_,_i,local_34);
      str_local._4_4_ = byte_len;
    }
    return str_local._4_4_;
  }
  __assert_fail("text",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Rodousse[P]SSSGems/third_party/glfw/deps/nuklear.h"
                ,0x20b7,"int nk_str_insert_text_utf8(struct nk_str *, int, const char *, int)");
}

Assistant:

NK_API int
nk_str_insert_text_utf8(struct nk_str *str, int pos, const char *text, int len)
{
    int i = 0;
    int byte_len = 0;
    nk_rune unicode;

    NK_ASSERT(str);
    NK_ASSERT(text);
    if (!str || !text || !len) return 0;
    for (i = 0; i < len; ++i)
        byte_len += nk_utf_decode(text+byte_len, &unicode, 4);
    nk_str_insert_at_rune(str, pos, text, byte_len);
    return len;
}